

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexeme_Constant.cpp
# Opt level: O0

RepresentationSuffix __thiscall psy::C::IntegerConstant::representationSuffix(IntegerConstant *this)

{
  bool bVar1;
  RepresentationSuffix local_25;
  RepresentationSuffix local_22;
  IntegerConstant *this_local;
  
  if (((this->super_Lexeme).field_0.BD_ >> 10 & 1) == 0) {
    if ((((this->super_Lexeme).field_0.BD_ >> 5 & 1) == 0) &&
       (((this->super_Lexeme).field_0.BD_ >> 6 & 1) == 0)) {
      this_local._7_1_ = uOrU;
      if (((this->super_Lexeme).field_0.BD_ >> 7 & 1) == 0) {
        this_local._7_1_ = ((this->super_Lexeme).field_0.BD_ >> 9 & 1) != 0;
      }
    }
    else {
      bVar1 = true;
      if (((this->super_Lexeme).field_0.BD_ >> 7 & 1) == 0) {
        bVar1 = ((this->super_Lexeme).field_0.BD_ >> 9 & 1) != 0;
      }
      local_25 = lOrLAnduOrU;
      if (!bVar1) {
        local_25 = lOrL;
      }
      this_local._7_1_ = local_25;
    }
  }
  else {
    bVar1 = true;
    if (((this->super_Lexeme).field_0.BD_ >> 7 & 1) == 0) {
      bVar1 = ((this->super_Lexeme).field_0.BD_ >> 9 & 1) != 0;
    }
    local_22 = llOrLLAnduOrU;
    if (!bVar1) {
      local_22 = llOrLL;
    }
    this_local._7_1_ = local_22;
  }
  return this_local._7_1_;
}

Assistant:

IntegerConstant::RepresentationSuffix IntegerConstant::representationSuffix() const
{
    if (F_.llOrLL_) {
        return (F_.u_ || F_.U_)
                ? RepresentationSuffix::llOrLLAnduOrU
                : RepresentationSuffix::llOrLL;
    }
    if (F_.l_ || F_.L_) {
        return (F_.u_ || F_.U_)
                ? RepresentationSuffix::lOrLAnduOrU
                : RepresentationSuffix::lOrL;
    }
    return (F_.u_ || F_.U_)
            ? RepresentationSuffix::uOrU
            : RepresentationSuffix::None;
}